

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_addr.cc
# Opt level: O2

void __thiscall iqnet::Inet_addr::Impl::Impl(Impl *this,string *h,int p)

{
  long lVar1;
  network_error *this_00;
  allocator<char> local_49;
  string local_48;
  
  (this->sa).super_type.m_initialized = false;
  std::__cxx11::string::string((string *)&this->host,(string *)h);
  this->port = p;
  lVar1 = std::__cxx11::string::find_first_of((char *)h,0x180655);
  if (lVar1 == -1) {
    return;
  }
  this_00 = (network_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Hostname must not contain CR LF characters",&local_49);
  network_error::network_error(this_00,&local_48,false,0);
  __cxa_throw(this_00,&network_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Inet_addr::Impl::Impl( const std::string& h, int p ):
  sa(), host(h), port(p)
{
  if (h.find_first_of("\n\r") != std::string::npos)
    throw network_error("Hostname must not contain CR LF characters", false);
}